

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_TextureMapping::RequiresVertexNormals(ON_TextureMapping *this)

{
  ON_TextureMapping *this_local;
  
  if (this->m_type == srfp_mapping) {
    this_local._7_1_ = false;
  }
  else if (this->m_projection == ray_projection) {
    this_local._7_1_ = true;
  }
  else if (this->m_type == box_mapping) {
    this_local._7_1_ = true;
  }
  else if ((this->m_type == cylinder_mapping) && ((this->m_bCapped & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else if (this->m_type == wcsbox_projection) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_TextureMapping::RequiresVertexNormals() const
{
  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
    return false;

	if(m_projection == ON_TextureMapping::PROJECTION::ray_projection)
    return true;

  if(m_type == ON_TextureMapping::TYPE::box_mapping)
    return true;
	if(m_type == ON_TextureMapping::TYPE::cylinder_mapping && m_bCapped)
    return true;

  if (m_type == ON_TextureMapping::TYPE::wcsbox_projection)
    return true;

	return false;
}